

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O3

FT_Error tt_face_load_name(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  FT_UInt16 FVar1;
  FT_UInt FVar2;
  uint uVar3;
  FT_ULong FVar4;
  TT_LangTagRec *P;
  FT_Pointer block;
  TT_NameRec *pTVar5;
  ulong uVar6;
  TT_NameTableRec *structure;
  FT_Pointer structure_00;
  ulong uVar7;
  TT_LangTagRec *structure_01;
  FT_Error error;
  FT_ULong table_len;
  FT_Error local_6c;
  ulong local_68;
  FT_ULong local_60;
  TT_NameTableRec *local_58;
  ulong local_50;
  ulong local_48;
  FT_ULong local_40;
  FT_ULong local_38;
  
  memory = stream->memory;
  (face->name_table).stream = stream;
  local_6c = (*face->goto_table)(face,0x6e616d65,stream,&local_38);
  if (local_6c == 0) {
    structure = &face->name_table;
    FVar4 = FT_Stream_Pos(stream);
    local_6c = FT_Stream_ReadFields(stream,tt_face_load_name::name_table_fields,structure);
    if (local_6c == 0) {
      uVar3 = (face->name_table).numNameRecords;
      uVar7 = uVar3 * 0xc + FVar4 + 6;
      uVar6 = local_38 + FVar4;
      if (uVar6 < uVar7) {
        local_6c = 0x91;
      }
      else {
        local_48 = uVar6;
        if (structure->format == 1) {
          local_6c = FT_Stream_Seek(stream,uVar7);
          if (local_6c == 0) {
            local_68 = uVar7;
            FVar1 = FT_Stream_ReadUShort(stream,&local_6c);
            (face->name_table).numLangTagRecords = (uint)FVar1;
            if (local_6c == 0) {
              local_50 = (ulong)(uint)FVar1;
              block = (void *)0x0;
              local_60 = FVar4;
              P = (TT_LangTagRec *)ft_mem_qrealloc(memory,0x18,0,local_50,(void *)0x0,&local_6c);
              uVar7 = local_50;
              if (local_6c != 0) goto LAB_00243c20;
              local_6c = FT_Stream_EnterFrame
                                   (stream,(ulong)((face->name_table).numLangTagRecords << 2));
              if (local_6c != 0) {
                block = (void *)0x0;
                goto LAB_00243c20;
              }
              local_40 = local_60 + 6;
              local_68 = local_68 + uVar7 * 4 + 2;
              local_6c = 0;
              local_58 = structure;
              if ((P != (TT_LangTagRec *)0x0) &&
                 (uVar7 = (ulong)(face->name_table).numLangTagRecords, uVar7 != 0)) {
                local_6c = 0;
                structure_01 = P;
                do {
                  local_6c = FT_Stream_ReadFields
                                       (stream,tt_face_load_name::langTag_record_fields,structure_01
                                       );
                  uVar6 = (face->name_table).storageOffset + local_60 + structure_01->stringOffset;
                  structure_01->stringOffset = uVar6;
                  if ((uVar6 < local_68) || (local_48 < uVar6 + structure_01->stringLength)) {
                    structure_01->stringLength = 0;
                  }
                  structure_01->string = (FT_Byte *)0x0;
                  structure_01 = structure_01 + 1;
                } while (structure_01 < P + uVar7);
              }
              (face->name_table).langTags = P;
              FT_Stream_ExitFrame(stream);
              local_6c = FT_Stream_Seek(stream,local_40);
              uVar3 = (face->name_table).numNameRecords;
              structure = local_58;
              uVar7 = local_68;
              FVar4 = local_60;
              goto LAB_00243ac0;
            }
          }
        }
        else {
LAB_00243ac0:
          local_60 = FVar4;
          local_68 = uVar7;
          P = (TT_LangTagRec *)0x0;
          block = ft_mem_qrealloc(memory,0x20,0,(ulong)uVar3,(void *)0x0,&local_6c);
          if (local_6c != 0) goto LAB_00243c20;
          local_6c = FT_Stream_EnterFrame(stream,(ulong)((face->name_table).numNameRecords * 0xc));
          uVar7 = 0;
          P = (TT_LangTagRec *)0x0;
          if (local_6c != 0) goto LAB_00243c20;
          FVar2 = (face->name_table).numNameRecords;
          local_58 = structure;
          if (FVar2 == 0) {
            uVar6 = 0;
          }
          else {
            uVar7 = 0;
            local_6c = 0;
            structure_00 = block;
            do {
              local_50 = CONCAT44(local_50._4_4_,FVar2);
              local_6c = FT_Stream_ReadFields
                                   (stream,tt_face_load_name::name_record_fields,structure_00);
              if ((local_6c == 0) && ((ulong)*(ushort *)((long)structure_00 + 8) != 0)) {
                uVar6 = (face->name_table).storageOffset + local_60 +
                        *(long *)((long)structure_00 + 0x10);
                *(ulong *)((long)structure_00 + 0x10) = uVar6;
                if (((local_68 <= uVar6) &&
                    (uVar6 + *(ushort *)((long)structure_00 + 8) <= local_48)) &&
                   (((local_58->format != 1 || (-1 < (short)*(ushort *)((long)structure_00 + 4))) ||
                    ((uVar3 = *(ushort *)((long)structure_00 + 4) - 0x8000,
                     uVar3 < (face->name_table).numLangTagRecords &&
                     ((face->name_table).langTags[uVar3].stringLength != 0)))))) {
                  *(undefined8 *)((long)structure_00 + 0x18) = 0;
                  uVar7 = (ulong)((int)uVar7 + 1);
                  structure_00 = (FT_Pointer)((long)structure_00 + 0x20);
                }
              }
              FVar2 = (int)local_50 - 1;
            } while (FVar2 != 0);
            uVar6 = (ulong)(face->name_table).numNameRecords;
          }
          pTVar5 = (TT_NameRec *)ft_mem_qrealloc(memory,0x20,uVar6,uVar7,block,&local_6c);
          (face->name_table).names = pTVar5;
          (face->name_table).numNameRecords = (FT_UInt)uVar7;
          FT_Stream_ExitFrame(stream);
          face->num_names = (FT_UShort)(face->name_table).numNameRecords;
        }
      }
    }
  }
  block = (void *)0x0;
  P = (TT_LangTagRec *)0x0;
LAB_00243c20:
  ft_mem_free(memory,block);
  ft_mem_free(memory,P);
  return local_6c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_name( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error      error;
    FT_Memory     memory = stream->memory;
    FT_ULong      table_pos, table_len;
    FT_ULong      storage_start, storage_limit;
    TT_NameTable  table;
    TT_Name       names    = NULL;
    TT_LangTag    langTags = NULL;

    static const FT_Frame_Field  name_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameTableRec

      FT_FRAME_START( 6 ),
        FT_FRAME_USHORT( format ),
        FT_FRAME_USHORT( numNameRecords ),
        FT_FRAME_USHORT( storageOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  name_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( platformID ),
        FT_FRAME_USHORT( encodingID ),
        FT_FRAME_USHORT( languageID ),
        FT_FRAME_USHORT( nameID ),
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  langTag_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_LangTagRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };


    table         = &face->name_table;
    table->stream = stream;

    error = face->goto_table( face, TTAG_name, stream, &table_len );
    if ( error )
      goto Exit;

    table_pos = FT_STREAM_POS();

    if ( FT_STREAM_READ_FIELDS( name_table_fields, table ) )
      goto Exit;

    /* Some popular Asian fonts have an invalid `storageOffset' value (it */
    /* should be at least `6 + 12*numNameRecords').  However, the string  */
    /* offsets, computed as `storageOffset + entry->stringOffset', are    */
    /* valid pointers within the name table...                            */
    /*                                                                    */
    /* We thus can't check `storageOffset' right now.                     */
    /*                                                                    */
    storage_start = table_pos + 6 + 12 * table->numNameRecords;
    storage_limit = table_pos + table_len;

    if ( storage_start > storage_limit )
    {
      FT_ERROR(( "tt_face_load_name: invalid `name' table\n" ));
      error = FT_THROW( Name_Table_Missing );
      goto Exit;
    }

    /* `name' format 1 contains additional language tag records, */
    /* which we load first                                       */
    if ( table->format == 1 )
    {
      if ( FT_STREAM_SEEK( storage_start )            ||
           FT_READ_USHORT( table->numLangTagRecords ) )
        goto Exit;

      storage_start += 2 + 4 * table->numLangTagRecords;

      /* allocate language tag records array */
      if ( FT_QNEW_ARRAY( langTags, table->numLangTagRecords ) ||
           FT_FRAME_ENTER( table->numLangTagRecords * 4 )      )
        goto Exit;

      /* load language tags */
      {
        TT_LangTag  entry = langTags;
        TT_LangTag  limit = FT_OFFSET( entry, table->numLangTagRecords );


        for ( ; entry < limit; entry++ )
        {
          (void)FT_STREAM_READ_FIELDS( langTag_record_fields, entry );

          /* check that the langTag string is within the table */
          entry->stringOffset += table_pos + table->storageOffset;
          if ( entry->stringOffset                       < storage_start ||
               entry->stringOffset + entry->stringLength > storage_limit )
          {
            /* invalid entry; ignore it */
            entry->stringLength = 0;
          }

          /* mark the string as not yet loaded */
          entry->string = NULL;
        }

        table->langTags = langTags;
        langTags        = NULL;
      }

      FT_FRAME_EXIT();

      (void)FT_STREAM_SEEK( table_pos + 6 );
    }

    /* allocate name records array */
    if ( FT_QNEW_ARRAY( names, table->numNameRecords ) ||
         FT_FRAME_ENTER( table->numNameRecords * 12 )  )
      goto Exit;

    /* load name records */
    {
      TT_Name  entry = names;
      FT_UInt  count = table->numNameRecords;
      FT_UInt  valid = 0;


      for ( ; count > 0; count-- )
      {
        if ( FT_STREAM_READ_FIELDS( name_record_fields, entry ) )
          continue;

        /* check that the name is not empty */
        if ( entry->stringLength == 0 )
          continue;

        /* check that the name string is within the table */
        entry->stringOffset += table_pos + table->storageOffset;
        if ( entry->stringOffset                       < storage_start ||
             entry->stringOffset + entry->stringLength > storage_limit )
        {
          /* invalid entry; ignore it */
          continue;
        }

        /* assure that we have a valid language tag ID, and   */
        /* that the corresponding langTag entry is valid, too */
        if ( table->format == 1 && entry->languageID >= 0x8000U )
        {
          if ( entry->languageID - 0x8000U >= table->numLangTagRecords    ||
               !table->langTags[entry->languageID - 0x8000U].stringLength )
          {
            /* invalid entry; ignore it */
            continue;
          }
        }

        /* mark the string as not yet converted */
        entry->string = NULL;

        valid++;
        entry++;
      }

      /* reduce array size to the actually used elements */
      FT_MEM_QRENEW_ARRAY( names,
                           table->numNameRecords,
                           valid );
      table->names          = names;
      names                 = NULL;
      table->numNameRecords = valid;
    }

    FT_FRAME_EXIT();

    /* everything went well, update face->num_names */
    face->num_names = (FT_UShort)table->numNameRecords;

  Exit:
    FT_FREE( names );
    FT_FREE( langTags );
    return error;
  }